

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O3

void __thiscall MppBufferService::inc_total(MppBufferService *this,RK_U32 size)

{
  RK_U32 *pRVar1;
  RK_U32 RVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  LOCK();
  pRVar1 = &this->total_size;
  RVar2 = *pRVar1;
  *pRVar1 = *pRVar1 + size;
  UNLOCK();
  do {
    uVar3 = this->total_max;
    uVar4 = uVar3;
    if (uVar3 < RVar2 + size) {
      uVar4 = RVar2 + size;
    }
    LOCK();
    bVar5 = uVar3 == this->total_max;
    if (bVar5) {
      this->total_max = uVar4;
    }
    UNLOCK();
  } while (!bVar5);
  return;
}

Assistant:

void MppBufferService::inc_total(RK_U32 size)
{
    RK_U32 total = MPP_ADD_FETCH(&total_size, size);
    bool ret;

    do {
        RK_U32 old_max = total_max;
        RK_U32 new_max = MPP_MAX(total, old_max);

        ret = MPP_BOOL_CAS(&total_max, old_max, new_max);
    } while (!ret);
}